

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

Pattern * __thiscall
InstructionPattern::commonSubPattern(InstructionPattern *this,Pattern *b,int4 sa)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  InstructionPattern *this_00;
  PatternBlock *this_01;
  PatternBlock *pPVar4;
  undefined4 extraout_var_01;
  pointer_____offset_0x10___ *__fn;
  void *in_R8;
  undefined1 auVar5 [16];
  undefined4 extraout_var_00;
  
  iVar2 = (*b->_vptr_Pattern[8])(b);
  if (iVar2 < 1) {
    lVar3 = __dynamic_cast(b,&Pattern::typeinfo,&CombinePattern::typeinfo);
    if (lVar3 == 0) {
      __fn = &Pattern::typeinfo;
      iVar2 = 0;
      auVar5 = __dynamic_cast(b,&Pattern::typeinfo,&ContextPattern::typeinfo);
      if (auVar5._0_8_ == 0) {
        if (sa < 0) {
          iVar2 = PatternBlock::clone(this->maskvalue,(__fn *)__fn,auVar5._8_8_,iVar2,in_R8);
          this_01 = (PatternBlock *)CONCAT44(extraout_var_01,iVar2);
          this_01->offset = this_01->offset - sa;
          PatternBlock::normalize(this_01);
          pPVar4 = PatternBlock::commonSubPattern(this_01,(PatternBlock *)b[1]._vptr_Pattern);
          PatternBlock::~PatternBlock(this_01);
        }
        else {
          iVar2 = PatternBlock::clone((PatternBlock *)b[1]._vptr_Pattern,(__fn *)__fn,auVar5._8_8_,
                                      iVar2,in_R8);
          this_01 = (PatternBlock *)CONCAT44(extraout_var_00,iVar2);
          this_01->offset = this_01->offset + sa;
          PatternBlock::normalize(this_01);
          pPVar4 = PatternBlock::commonSubPattern(this->maskvalue,this_01);
          puVar1 = (this_01->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
          puVar1 = (this_01->maskvec).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (puVar1 != (pointer)0x0) {
            operator_delete(puVar1);
          }
        }
        operator_delete(this_01);
        this_00 = (InstructionPattern *)operator_new(0x10);
        (this_00->super_DisjointPattern).super_Pattern._vptr_Pattern =
             (_func_int **)&PTR__InstructionPattern_003ce338;
        this_00->maskvalue = pPVar4;
      }
      else {
        this_00 = (InstructionPattern *)operator_new(0x10);
        InstructionPattern(this_00,true);
      }
      return (Pattern *)this_00;
    }
  }
  iVar2 = (*b->_vptr_Pattern[6])(b,this,(ulong)(uint)-sa);
  return (Pattern *)CONCAT44(extraout_var,iVar2);
}

Assistant:

Pattern *InstructionPattern::commonSubPattern(const Pattern *b,int4 sa) const

{
  if (b->numDisjoint()>0)
    return b->commonSubPattern(this,-sa);

  const CombinePattern *b2 = dynamic_cast<const CombinePattern *>(b);
  if (b2 != (const CombinePattern *)0)
    return b->commonSubPattern(this,-sa);

  const ContextPattern *b3 = dynamic_cast<const ContextPattern *>(b);
  if (b3 != (const ContextPattern *)0) {
    InstructionPattern *res = new InstructionPattern(true);
    return res;
  }
  const InstructionPattern *b4 = (const InstructionPattern *)b;
  
  PatternBlock *respattern;
  if (sa < 0) {
    PatternBlock *a = maskvalue->clone();
    a->shift(-sa);
    respattern = a->commonSubPattern(b4->maskvalue);
    delete a;
  }
  else {
    PatternBlock *c = b4->maskvalue->clone();
    c->shift(sa);
    respattern = maskvalue->commonSubPattern(c);
    delete c;
  }
  return new InstructionPattern(respattern);
}